

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O3

optional<pbrt::ShapeSample> * __thiscall
pbrt::Cylinder::Sample
          (optional<pbrt::ShapeSample> *__return_storage_ptr__,Cylinder *this,
          ShapeSampleContext *ctx,Point2f u)

{
  Float FVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  anon_struct_8_0_00000001_for___align aVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  aligned_storage_t<sizeof(pbrt::ShapeSample),_alignof(pbrt::ShapeSample)> local_78;
  bool local_20;
  
  Sample((optional<pbrt::ShapeSample> *)&local_78.__align,this,u);
  if (local_20 == false) {
    LogFatal<char_const(&)[4]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
               ,0xea,"Check failed: %s",(char (*) [4])0x280907c);
  }
  FVar1 = ctx->time;
  auVar11._4_4_ = local_78._4_4_;
  auVar11._0_4_ = local_78._0_4_;
  auVar11._8_4_ = local_78._8_4_;
  auVar11._12_4_ = local_78._12_4_;
  auVar3._0_4_ = (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x
                 .low;
  auVar3._4_4_ = (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x
                 .high;
  auVar3._8_4_ = (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y
                 .low;
  auVar3._12_4_ =
       (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
  uVar2 = *(undefined8 *)
           &(ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high
  ;
  auVar11 = vinsertps_avx(auVar11,ZEXT416((uint)local_78._12_4_),0x10);
  auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                              super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),
                         0x10);
  fVar5 = ((float)local_78._16_4_ + (float)local_78._20_4_) * 0.5;
  auVar13._0_4_ = ((float)local_78._4_4_ + auVar11._0_4_) * 0.5;
  auVar13._4_4_ = ((float)local_78._8_4_ + auVar11._4_4_) * 0.5;
  auVar13._8_4_ = (auVar11._8_4_ + 0.0) * 0.5;
  auVar13._12_4_ = (auVar11._12_4_ + 0.0) * 0.5;
  auVar15._0_4_ = ((float)uVar2 + auVar3._0_4_) * 0.5;
  auVar15._4_4_ = ((float)((ulong)uVar2 >> 0x20) + auVar3._4_4_) * 0.5;
  auVar15._8_4_ = (auVar3._8_4_ + 0.0) * 0.5;
  auVar15._12_4_ = (auVar3._12_4_ + 0.0) * 0.5;
  fVar6 = ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
          (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high)
          * 0.5;
  auVar11 = vsubps_avx(auVar13,auVar15);
  fVar4 = auVar11._0_4_;
  auVar17._0_4_ = fVar4 * fVar4;
  auVar17._4_4_ = auVar11._4_4_ * auVar11._4_4_;
  auVar17._8_4_ = auVar11._8_4_ * auVar11._8_4_;
  auVar17._12_4_ = auVar11._12_4_ * auVar11._12_4_;
  auVar3 = vhaddps_avx(auVar17,auVar17);
  fVar7 = fVar5 - fVar6;
  fVar12 = auVar3._0_4_ + fVar7 * fVar7;
  if ((fVar12 != 0.0) || (NAN(fVar12))) {
    auVar17 = vsqrtss_avx(ZEXT416((uint)fVar12),ZEXT416((uint)fVar12));
    auVar10._8_4_ = 0x80000000;
    auVar10._0_8_ = 0x8000000080000000;
    auVar10._12_4_ = 0x80000000;
    auVar10 = vxorps_avx512vl(ZEXT416((uint)fVar7),auVar10);
    auVar3 = vsubps_avx(auVar15,auVar13);
    fVar6 = fVar6 - fVar5;
    auVar14._0_4_ = auVar3._0_4_ * auVar3._0_4_;
    auVar14._4_4_ = auVar3._4_4_ * auVar3._4_4_;
    auVar14._8_4_ = auVar3._8_4_ * auVar3._8_4_;
    auVar14._12_4_ = auVar3._12_4_ * auVar3._12_4_;
    auVar3 = vhaddps_avx(auVar14,auVar14);
    fVar12 = auVar17._0_4_;
    auVar18._0_4_ = auVar10._0_4_ / fVar12;
    auVar18._4_12_ = auVar10._4_12_;
    auVar19._0_4_ = fVar4 / fVar12;
    auVar19._4_12_ = auVar11._4_12_;
    auVar11 = vmovshdup_avx(auVar11);
    auVar16._0_4_ = auVar11._0_4_ / fVar12;
    auVar16._4_12_ = auVar11._4_12_;
    auVar13 = vfnmadd132ss_fma(auVar16,ZEXT416((uint)(auVar18._0_4_ * (float)local_78._48_4_)),
                               ZEXT416((uint)local_78._44_4_));
    auVar11 = vfmsub213ss_fma(auVar18,ZEXT416((uint)local_78._48_4_),
                              ZEXT416((uint)(auVar18._0_4_ * (float)local_78._48_4_)));
    auVar11 = vfnmadd231ss_fma(ZEXT416((uint)(auVar13._0_4_ + auVar11._0_4_)),auVar19,
                               ZEXT416((uint)local_78._40_4_));
    auVar8._8_4_ = 0x7fffffff;
    auVar8._0_8_ = 0x7fffffff7fffffff;
    auVar8._12_4_ = 0x7fffffff;
    auVar11 = vandps_avx512vl(auVar11,auVar8);
    fVar12 = (float)local_78._80_4_ / (auVar11._0_4_ / (auVar3._0_4_ + fVar6 * fVar6));
    if (ABS(fVar12) != INFINITY) {
      aVar9._4_4_ = local_78._4_4_;
      aVar9._0_4_ = local_78._0_4_;
      __return_storage_ptr__->set = local_20;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = local_78._64_8_;
      (__return_storage_ptr__->optionalValue).__align = aVar9;
      *(ulong *)((long)&__return_storage_ptr__->optionalValue + 8) =
           CONCAT44(local_78._12_4_,local_78._8_4_);
      *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x10) =
           CONCAT44(local_78._20_4_,local_78._16_4_);
      *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x18) =
           CONCAT44(local_78._28_4_,FVar1);
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = local_78._32_8_;
      *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x28) =
           CONCAT44(local_78._44_4_,local_78._40_4_);
      *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x30) =
           CONCAT44(local_78._52_4_,local_78._48_4_);
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = local_78._56_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = local_78._72_8_;
      *(float *)((long)&__return_storage_ptr__->optionalValue + 0x50) = fVar12;
      return __return_storage_ptr__;
    }
  }
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
  *(undefined8 *)&__return_storage_ptr__->set = 0;
  (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<ShapeSample> Sample(const ShapeSampleContext &ctx, Point2f u) const {
        // Uniformly sample shape and compute incident direction _wi_
        pstd::optional<ShapeSample> ss = Sample(u);
        DCHECK(ss.has_value());
        ss->intr.time = ctx.time;
        Vector3f wi = ss->intr.p() - ctx.p();
        if (LengthSquared(wi) == 0)
            return {};
        wi = Normalize(wi);

        // Convert uniform area sample PDF in _ss_ to solid angle measure
        ss->pdf /= AbsDot(ss->intr.n, -wi) / DistanceSquared(ctx.p(), ss->intr.p());
        if (IsInf(ss->pdf))
            return {};

        return ss;
    }